

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

ufile_error ufile_load_config_from_json(char *json_buf,ufile_config *cfg)

{
  int iVar1;
  uint uVar2;
  cJSON *item;
  char *pcVar3;
  ufile_config *puVar4;
  cJSON *pcVar5;
  ufile_error uVar6;
  
  item = cJSON_Parse(json_buf);
  if (item == (cJSON *)0x0) {
    uVar2 = 0xfffffffe;
    pcVar3 = cJSON_GetErrorPtr();
  }
  else {
    pcVar5 = item->child;
    if (pcVar5 != (cJSON *)0x0) {
      do {
        pcVar3 = pcVar5->string;
        iVar1 = strcmp(pcVar3,"public_key");
        puVar4 = cfg;
        if (iVar1 == 0) {
LAB_00103770:
          pcVar3 = ufile_strconcat(pcVar5->valuestring,0);
          puVar4->public_key = pcVar3;
        }
        else {
          iVar1 = strcmp(pcVar3,"private_key");
          puVar4 = (ufile_config *)&cfg->private_key;
          if (iVar1 == 0) goto LAB_00103770;
          iVar1 = strcmp(pcVar3,"file_host");
          puVar4 = (ufile_config *)&cfg->file_host;
          if (iVar1 == 0) goto LAB_00103770;
          iVar1 = strcmp(pcVar3,"bucket_host");
          puVar4 = (ufile_config *)&cfg->bucket_host;
          if (iVar1 == 0) goto LAB_00103770;
        }
        pcVar5 = pcVar5->next;
      } while (pcVar5 != (cJSON *)0x0);
    }
    cJSON_Delete(item);
    uVar6 = config_validation(*cfg);
    pcVar3 = uVar6.message;
    uVar2 = uVar6.code;
  }
  uVar6._4_4_ = 0;
  uVar6.code = uVar2;
  uVar6.message = pcVar3;
  return uVar6;
}

Assistant:

struct ufile_error
ufile_load_config_from_json(const char* json_buf, struct ufile_config *cfg){
    struct ufile_error error = NO_ERROR;
    struct cJSON *json = cJSON_Parse(json_buf); 
    if(json==NULL){
        error.code = UFILE_CONFIG_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        return error;
    }
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "public_key") == 0){
            cfg->public_key = ufile_strconcat(item->valuestring,NULL);
        }else if(strcmp(item->string,"private_key") == 0){
            cfg->private_key = ufile_strconcat(item->valuestring, NULL);
        }else if(strcmp(item->string,"file_host") == 0){
            cfg->file_host = ufile_strconcat(item->valuestring, NULL);
        }else if(strcmp(item->string,"bucket_host") == 0){
            cfg->bucket_host = ufile_strconcat(item->valuestring, NULL);
        }
        item = item->next;
    }
    cJSON_Delete(json);
    error = config_validation(*cfg);
    return error;
}